

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::SetCorrFiles(CEExecOptions *this)

{
  string *psVar1;
  long lVar2;
  CLOptions *in_RDI;
  string *in_stack_fffffffffffffe20;
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"nutation",&local_49);
  CLOptions::AsString(in_RDI,in_stack_fffffffffffffe20);
  psVar1 = (string *)std::__cxx11::string::size();
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (psVar1 != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"nutation",&local_a1);
    CLOptions::AsString(in_RDI,psVar1);
    CppEphem::SetNutationFile(local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"ttut1hist",&local_e9);
  CLOptions::AsString(in_RDI,psVar1);
  lVar2 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"ttut1hist",&local_131);
    CLOptions::AsString(in_RDI,psVar1);
    CppEphem::SetTtUt1HistFile(local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"ttut1pred",&local_179);
  CLOptions::AsString(in_RDI,psVar1);
  lVar2 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"ttut1pred",&local_1c1);
    CLOptions::AsString(in_RDI,psVar1);
    CppEphem::SetTtUt1PredFile(local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  return;
}

Assistant:

inline 
void CEExecOptions::SetCorrFiles(void)
{
    // Nutation
    if (AsString("nutation").size() > 0) {
        CppEphem::SetNutationFile(AsString("nutation"));
    }
    // TT - UT1 (historical)
    if (AsString("ttut1hist").size() > 0) {
        CppEphem::SetTtUt1HistFile(AsString("ttut1hist"));
    }
    // TT - UT1 (predictions)
    if (AsString("ttut1pred").size() > 0) {
        CppEphem::SetTtUt1PredFile(AsString("ttut1pred"));
    }
}